

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O3

void ssw_strip(char **str)

{
  ulong uVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  
  pcVar4 = *str;
  sVar3 = strlen(pcVar4);
  lVar5 = 0;
  uVar1 = 0;
  do {
    uVar6 = uVar1;
    lVar5 = lVar5 + -1;
    uVar1 = uVar6 + 1;
  } while (pcVar4[uVar6] == ' ');
  if (uVar1 != 1) {
    memmove(pcVar4,pcVar4 + uVar6,(sVar3 - uVar1) + 2);
  }
  if ((uVar6 < sVar3) && ((*str)[lVar5 + sVar3] == ' ')) {
    pcVar4 = *str + (sVar3 - uVar1);
    lVar5 = sVar3 - uVar1;
    do {
      *pcVar4 = '\0';
      if (lVar5 == 0) {
        return;
      }
      pcVar4 = *str + lVar5 + -1;
      lVar2 = lVar5 + -1;
      lVar5 = lVar5 + -1;
    } while ((*str)[lVar2] == ' ');
  }
  return;
}

Assistant:

void ssw_strip(char **str) {
  size_t l = strlen(*str);
  size_t i = 0;
  while ((*str)[i]==' ')
    ++i;
  if (i)
    memmove(*str,*str+i,l+1-i);
  if ( l <= i )
    return;
  i = (size_t)((l-i)-1);
  while ( (*str)[i]==' ' ) {
    (*str)[i]='\0';
    if (!i)
      break;
    --i;
  }
}